

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_approximate(double *probs,size_t n,double tol)

{
  uint uVar1;
  uint32_t *data;
  undefined1 auVar2 [16];
  inform_dist *dist;
  size_t i_2;
  ulong uStack_48;
  int g;
  size_t i_1;
  uint32_t *counts;
  size_t i;
  double diff;
  double tol_local;
  size_t n_local;
  double *probs_local;
  
  if ((probs == (double *)0x0) || (n == 0)) {
    probs_local = (double *)0x0;
  }
  else {
    i = 0x3ff0000000000000;
    for (counts = (uint32_t *)0x0; counts < n; counts = (uint32_t *)((long)counts + 1)) {
      i = (size_t)((double)i - probs[(long)counts]);
      if (probs[(long)counts] <= 0.0 && probs[(long)counts] != 0.0) {
        return (inform_dist *)0x0;
      }
    }
    auVar2._8_4_ = (int)(n >> 0x20);
    auVar2._0_8_ = n;
    auVar2._12_4_ = 0x45300000;
    if (ABS((double)i) <=
        ((auVar2._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * ABS(tol)) {
      data = (uint32_t *)malloc(n << 2);
      if (data == (uint32_t *)0x0) {
        probs_local = (double *)0x0;
      }
      else {
        for (uStack_48 = 0; uStack_48 < n; uStack_48 = uStack_48 + 1) {
          data[uStack_48] = (uint32_t)(long)(probs[uStack_48] / ABS(tol));
        }
        uVar1 = gcd(data,n);
        for (dist = (inform_dist *)0x0; dist < n; dist = (inform_dist *)((long)&dist->histogram + 1)
            ) {
          data[(long)dist] = data[(long)dist] / uVar1;
        }
        probs_local = (double *)inform_dist_create(data,n);
        free(data);
      }
    }
    else {
      probs_local = (double *)0x0;
    }
  }
  return (inform_dist *)probs_local;
}

Assistant:

inform_dist* inform_dist_approximate(double const *probs, size_t n, double tol)
{
    if (probs == NULL || n == 0)
    {
        return NULL;
    }
    tol = fabs(tol);
    // check the validity of the probability distribution
    double diff = 1.0;
    for (size_t i = 0; i < n; ++i)
    {
        diff -= probs[i];
        if (probs[i] < 0.0) return NULL;
    }
    if (fabs(diff) > (double)n * tol)
    {
        return NULL;
    }
    // determine the number of counts
    uint32_t *counts = malloc(n * sizeof(int));
    if (counts == NULL)
    {
        return NULL;
    }
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] = (uint32_t)(probs[i] / tol);
    }
    int g = gcd(counts, n);
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] /= g;
    }
    // create the distribution
    inform_dist *dist = inform_dist_create(counts, n);
    free(counts);
    return dist;
}